

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int erkStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  int iVar1;
  ARKodeERKStepMem in_RAX;
  ARKodeERKStepMem step_mem;
  ARKodeERKStepMem local_18;
  
  local_18 = in_RAX;
  iVar1 = erkStep_AccessStepMem(ark_mem,"erkStep_WriteParameters",&local_18);
  if (iVar1 == 0) {
    fwrite("ERKStep time step module parameters:\n",0x25,1,(FILE *)fp);
    fprintf((FILE *)fp,"  Method order %i\n",(ulong)(uint)local_18->q);
    fputc(10,(FILE *)fp);
  }
  return iVar1;
}

Assistant:

int erkStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* print integrator parameters to file */
  fprintf(fp, "ERKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n", step_mem->q);
  fprintf(fp, "\n");

  return (ARK_SUCCESS);
}